

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O0

vector<Section_*,_std::allocator<Section_*>_> *
get_sections_by_input_blob(deque<Section_*,_std::allocator<Section_*>_> *dnet,string *blob)

{
  bool bVar1;
  __type _Var2;
  reference ppSVar3;
  reference pbVar4;
  _Self *in_RDX;
  undefined8 in_RSI;
  vector<Section_*,_std::allocator<Section_*>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Section *s;
  iterator __end1;
  iterator __begin1;
  deque<Section_*,_std::allocator<Section_*>_> *__range1;
  vector<Section_*,_std::allocator<Section_*>_> *ret;
  _Self *in_stack_ffffffffffffff28;
  vector<Section_*,_std::allocator<Section_*>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  Section *local_70;
  _Deque_iterator<Section_*,_Section_*&,_Section_**> local_48;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_10;
  
  local_19 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::vector<Section_*,_std::allocator<Section_*>_>::vector
            ((vector<Section_*,_std::allocator<Section_*>_> *)0x10459e);
  local_28 = local_10;
  std::deque<Section_*,_std::allocator<Section_*>_>::begin
            ((deque<Section_*,_std::allocator<Section_*>_> *)in_stack_ffffffffffffff28);
  std::deque<Section_*,_std::allocator<Section_*>_>::end
            ((deque<Section_*,_std::allocator<Section_*>_> *)in_stack_ffffffffffffff28);
  while (bVar1 = std::operator!=(in_RDX,in_stack_ffffffffffffff28), bVar1) {
    ppSVar3 = std::_Deque_iterator<Section_*,_Section_*&,_Section_**>::operator*(&local_48);
    local_70 = *ppSVar3;
    local_78 = &local_70->input_blobs;
    local_80._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff28);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_RDX,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_80);
      std::__cxx11::string::string(local_a8,(string *)pbVar4);
      _Var2 = std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      if (_Var2) {
        std::vector<Section_*,_std::allocator<Section_*>_>::push_back(this,(value_type *)in_RDI);
      }
      std::__cxx11::string::~string(local_a8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_80);
    }
    std::_Deque_iterator<Section_*,_Section_*&,_Section_**>::operator++(in_RDX);
  }
  return this;
}

Assistant:

std::vector<Section*> get_sections_by_input_blob(std::deque<Section*>& dnet, std::string blob)
{
    std::vector<Section*> ret;
    for (auto s : dnet)
        for (auto b : s->input_blobs)
            if (b == blob)
                ret.push_back(s);
    return ret;
}